

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ObjectFile.cpp
# Opt level: O2

void __thiscall
ObjectFile::ObjectFile
          (ObjectFile *this,OSToken *parent,string *inPath,int inUmask,string *inLockpath,bool isNew
          )

{
  _Rb_tree_header *p_Var1;
  string *psVar2;
  pointer pcVar3;
  Generation *pGVar4;
  MutexFactory *this_00;
  Mutex *pMVar5;
  string local_50;
  
  (this->super_OSObject)._vptr_OSObject = (_func_int **)&PTR__ObjectFile_0019ea60;
  (this->path)._M_dataplus._M_p = (pointer)&(this->path).field_2;
  (this->path)._M_string_length = 0;
  (this->path).field_2._M_local_buf[0] = '\0';
  p_Var1 = &(this->attributes)._M_t._M_impl.super__Rb_tree_header;
  (this->attributes)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->attributes)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->attributes)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->attributes)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->attributes)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  psVar2 = &this->path;
  (this->lockpath)._M_dataplus._M_p = (pointer)&(this->lockpath).field_2;
  (this->lockpath)._M_string_length = 0;
  (this->lockpath).field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::_M_assign((string *)psVar2);
  this->umask = inUmask;
  std::__cxx11::string::string((string *)&local_50,(string *)psVar2);
  pGVar4 = Generation::create(&local_50,this->umask,false);
  this->gen = pGVar4;
  std::__cxx11::string::~string((string *)&local_50);
  this_00 = MutexFactory::i();
  pMVar5 = MutexFactory::getMutex(this_00);
  this->objectMutex = pMVar5;
  this->valid = pMVar5 != (Mutex *)0x0 && this->gen != (Generation *)0x0;
  this->token = parent;
  this->inTransaction = false;
  this->transactionLockFile = (File *)0x0;
  std::__cxx11::string::_M_assign((string *)&this->lockpath);
  if (this->valid != false) {
    pcVar3 = (psVar2->_M_dataplus)._M_p;
    if (isNew) {
      softHSMLog(7,"ObjectFile",
                 "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/object_store/ObjectFile.cpp"
                 ,0x4a,"Created new object %s",pcVar3);
      store(this,false);
    }
    else {
      softHSMLog(7,"ObjectFile",
                 "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/object_store/ObjectFile.cpp"
                 ,0x44,"Opened existing object %s",pcVar3);
      refresh(this,true);
    }
  }
  return;
}

Assistant:

ObjectFile::ObjectFile(OSToken* parent, std::string inPath, int inUmask, std::string inLockpath, bool isNew /* = false */)
{
	path = inPath;
	umask = inUmask;
	gen = Generation::create(path, umask, false);
	objectMutex = MutexFactory::i()->getMutex();
	valid = (gen != NULL) && (objectMutex != NULL);
	token = parent;
	inTransaction = false;
	transactionLockFile = NULL;
	lockpath = inLockpath;

	if (!valid) return;

	if (!isNew)
	{
		DEBUG_MSG("Opened existing object %s", path.c_str());

		refresh(true);
	}
	else
	{
		DEBUG_MSG("Created new object %s", path.c_str());

		// Create an empty object file
		store();
	}

}